

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiTiledPartThreading.cpp
# Opt level: O0

void anon_unknown.dwarf_1bc0bf::readFiles(string *fn)

{
  float fVar1;
  bool bVar2;
  byte bVar3;
  __type _Var4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  float *pfVar9;
  Vec2<float> *this;
  Vec2<float> *v;
  int *piVar10;
  ChannelList *this_00;
  ChannelList *pCVar11;
  reference pvVar12;
  Array2D<float> *this_01;
  int i_4;
  int i_3;
  int numYTiles;
  int numXTiles;
  ThreadPool *threadPool;
  TaskGroup taskGroup;
  FrameBuffer *frameBuffer;
  int i_2;
  FrameBuffer frameBuffers [2];
  int h;
  int w;
  int yLevel;
  int xLevel;
  int numYLevels;
  int numXLevels;
  TiledInputPart *part;
  TiledInputPart part_1;
  int i_1;
  vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_> parts;
  Array2D<Imath_3_2::half> hData [2];
  Array2D<float> fData [2];
  Array2D<unsigned_int> uData [2];
  Header *header;
  size_t i;
  MultiPartInputFile file;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  ReadingTask *in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbc0;
  Array2D<Imath_3_2::half> *local_410;
  Array2D<Imath_3_2::half> *local_3f8;
  Array2D<Imath_3_2::half> *local_3e0;
  undefined1 *local_3b0;
  Array2D<float> *in_stack_fffffffffffffc68;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffc70;
  Array2D<float> *in_stack_fffffffffffffc78;
  Array2D<unsigned_int> *in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc8c;
  Array2D<float> *in_stack_fffffffffffffc90;
  undefined1 *puVar13;
  undefined1 *local_358;
  Array2D<Imath_3_2::half> *local_2e8;
  Array2D<Imath_3_2::half> *local_2c8;
  Array2D<Imath_3_2::half> *local_2a8;
  int local_1b8;
  int local_1b4;
  TaskGroup local_1a0 [8];
  undefined1 *local_198;
  int local_18c;
  undefined1 local_188 [96];
  undefined1 auStack_128 [8];
  int local_120;
  undefined4 local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  reference local_108;
  TiledInputPart local_100 [12];
  int local_f4;
  vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_> local_f0;
  Array2D<Imath_3_2::half> local_d8 [2];
  Array2D<Imath_3_2::half> local_a8 [2];
  Array2D<Imath_3_2::half> local_78 [2];
  Array2D<Imath_3_2::half> local_48;
  MultiPartInputFile local_28 [40];
  
  poVar7 = std::operator<<((ostream *)&std::cout,"Checking headers ");
  std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_28,pcVar8,iVar5,true);
  iVar5 = Imf_3_4::MultiPartInputFile::parts();
  if (iVar5 != 2) {
    __assert_fail("file.parts () == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                  ,0x176,"void (anonymous namespace)::readFiles(const std::string &)");
  }
  local_48._sizeY = 0;
  while( true ) {
    if (1 < (ulong)local_48._sizeY) {
      local_2a8 = local_78;
      do {
        Imf_3_4::Array2D<unsigned_int>::Array2D((Array2D<unsigned_int> *)local_2a8);
        local_2a8 = local_2a8 + 1;
      } while (local_2a8 != &local_48);
      local_2c8 = local_a8;
      do {
        Imf_3_4::Array2D<float>::Array2D((Array2D<float> *)local_2c8);
        local_2c8 = local_2c8 + 1;
      } while (local_2c8 != local_78);
      local_2e8 = local_d8;
      do {
        Imf_3_4::Array2D<Imath_3_2::half>::Array2D(local_2e8);
        local_2e8 = local_2e8 + 1;
      } while (local_2e8 != local_a8);
      std::vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::vector
                ((vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_> *)
                 0x1d6b09);
      for (local_f4 = 0; local_f4 < 2; local_f4 = local_f4 + 1) {
        Imf_3_4::TiledInputPart::TiledInputPart(local_100,local_28,local_f4);
        std::vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::push_back
                  ((vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_> *)
                   in_stack_fffffffffffffba0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"Reading and comparing files ");
      std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
      local_108 = std::vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::
                  operator[](&local_f0,0);
      local_10c = Imf_3_4::TiledInputPart::numXLevels();
      local_110 = Imf_3_4::TiledInputPart::numYLevels();
      local_114 = 0;
      do {
        if (local_10c <= local_114) {
          std::vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::~vector
                    ((vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_> *)
                     in_stack_fffffffffffffba0);
          local_3e0 = local_a8;
          do {
            local_3e0 = local_3e0 + -1;
            Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          } while (local_3e0 != local_d8);
          local_3f8 = local_78;
          do {
            local_3f8 = local_3f8 + -1;
            Imf_3_4::Array2D<float>::~Array2D
                      ((Array2D<float> *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          } while (local_3f8 != local_a8);
          local_410 = &local_48;
          do {
            local_410 = local_410 + -1;
            Imf_3_4::Array2D<unsigned_int>::~Array2D
                      ((Array2D<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          } while (local_410 != local_78);
          Imf_3_4::MultiPartInputFile::~MultiPartInputFile
                    ((MultiPartInputFile *)
                     CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          return;
        }
        for (local_118 = 0; local_118 < local_110; local_118 = local_118 + 1) {
          bVar3 = Imf_3_4::TiledInputPart::isValidLevel((int)local_108,local_114);
          if ((bVar3 & 1) != 0) {
            local_11c = Imf_3_4::TiledInputPart::levelWidth((int)local_108);
            local_120 = Imf_3_4::TiledInputPart::levelHeight((int)local_108);
            local_358 = local_188;
            puVar13 = auStack_128;
            do {
              Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1d6e55);
              local_358 = local_358 + 0x30;
            } while (local_358 != puVar13);
            for (local_18c = 0; local_18c < 2; local_18c = local_18c + 1) {
              local_198 = local_188 + (long)local_18c * 0x30;
              in_stack_fffffffffffffb88 = local_120;
              setInputFrameBuffer((FrameBuffer *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c
                                  ,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                                  in_stack_fffffffffffffc70,
                                  (int)((ulong)in_stack_fffffffffffffc68 >> 0x20),(int)puVar13);
              pvVar12 = std::
                        vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::
                        operator[](&local_f0,(long)local_18c);
              Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)pvVar12);
            }
            IlmThread_3_4::TaskGroup::TaskGroup(local_1a0);
            this_01 = (Array2D<float> *)operator_new(0x10);
            IlmThread_3_4::ThreadPool::ThreadPool((ThreadPool *)this_01,2);
            in_stack_fffffffffffffc90 = this_01;
            iVar5 = Imf_3_4::TiledInputPart::numXTiles((int)local_108);
            in_stack_fffffffffffffc8c = iVar5;
            iVar6 = Imf_3_4::TiledInputPart::numYTiles((int)local_108);
            for (local_1b4 = 0; local_1b4 < iVar6; local_1b4 = local_1b4 + 1) {
              in_stack_fffffffffffffc78 = this_01;
              in_stack_fffffffffffffc80 = (Array2D<unsigned_int> *)operator_new(0x28);
              std::vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::
              operator[](&local_f0,0);
              ReadingTask::ReadingTask
                        (in_stack_fffffffffffffbb0,(TaskGroup *)in_stack_fffffffffffffba8,
                         (TiledInputPart *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                         in_stack_fffffffffffffb98,in_stack_fffffffffffffb94,
                         in_stack_fffffffffffffbc0);
              IlmThread_3_4::ThreadPool::addTask((Task *)in_stack_fffffffffffffc78);
              in_stack_fffffffffffffc68 = this_01;
              in_stack_fffffffffffffc70 = (Array2D<Imath_3_2::half> *)operator_new(0x28);
              std::vector<Imf_3_4::TiledInputPart,_std::allocator<Imf_3_4::TiledInputPart>_>::
              operator[](&local_f0,1);
              in_stack_fffffffffffffb88 = iVar5;
              ReadingTask::ReadingTask
                        (in_stack_fffffffffffffbb0,(TaskGroup *)in_stack_fffffffffffffba8,
                         (TiledInputPart *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                         in_stack_fffffffffffffb98,in_stack_fffffffffffffb94,
                         in_stack_fffffffffffffbc0);
              IlmThread_3_4::ThreadPool::addTask((Task *)in_stack_fffffffffffffc68);
            }
            if (this_01 != (Array2D<float> *)0x0) {
              (**(code **)(this_01->_sizeX + 8))();
            }
            for (local_1b8 = 0; local_1b8 < 2; local_1b8 = local_1b8 + 1) {
              iVar5 = *(int *)((long)&(anonymous_namespace)::pixelTypes + (long)local_1b8 * 4);
              if (iVar5 == 0) {
                bVar2 = checkPixels<unsigned_int>
                                  ((Array2D<unsigned_int> *)
                                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                   in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88);
                if (!bVar2) {
                  __assert_fail("checkPixels<unsigned int> (uData[i], w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                                ,0x1ca,"void (anonymous namespace)::readFiles(const std::string &)")
                  ;
                }
              }
              else if (iVar5 == 1) {
                bVar2 = checkPixels<float>((Array2D<float> *)
                                           CONCAT44(in_stack_fffffffffffffb94,
                                                    in_stack_fffffffffffffb90),
                                           in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88);
                if (!bVar2) {
                  __assert_fail("checkPixels<float> (fData[i], w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                                ,0x1cc,"void (anonymous namespace)::readFiles(const std::string &)")
                  ;
                }
              }
              else if ((iVar5 == 2) &&
                      (bVar2 = checkPixels<Imath_3_2::half>
                                         ((Array2D<Imath_3_2::half> *)
                                          CONCAT44(in_stack_fffffffffffffb94,
                                                   in_stack_fffffffffffffb90),
                                          in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                      !bVar2)) {
                __assert_fail("checkPixels<half> (hData[i], w, h)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                              ,0x1cd,"void (anonymous namespace)::readFiles(const std::string &)");
              }
            }
            IlmThread_3_4::TaskGroup::~TaskGroup(local_1a0);
            local_3b0 = auStack_128;
            do {
              local_3b0 = local_3b0 + -0x30;
              Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1d73db);
            } while (local_3b0 != local_188);
          }
        }
        local_114 = local_114 + 1;
      } while( true );
    }
    local_48._sizeX = Imf_3_4::MultiPartInputFile::header((int)local_28);
    Imf_3_4::Header::displayWindow();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    Imf_3_4::Header::displayWindow();
    bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      (in_stack_fffffffffffffba0,
                       (Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    if (!bVar2) {
      __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x17a,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    Imf_3_4::Header::dataWindow();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    Imf_3_4::Header::dataWindow();
    bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      (in_stack_fffffffffffffba0,
                       (Box<Imath_3_2::Vec2<int>_> *)
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    if (!bVar2) {
      __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x17b,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    pfVar9 = (float *)Imf_3_4::Header::pixelAspectRatio();
    fVar1 = *pfVar9;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    pfVar9 = (float *)Imf_3_4::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar9) || (NAN(fVar1) || NAN(*pfVar9))) {
      __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x17c,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    this = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    v = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
    bVar2 = Imath_3_2::Vec2<float>::operator==(this,v);
    if (!bVar2) {
      __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x17e,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    pfVar9 = (float *)Imf_3_4::Header::screenWindowWidth();
    fVar1 = *pfVar9;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    pfVar9 = (float *)Imf_3_4::Header::screenWindowWidth();
    if ((fVar1 != *pfVar9) || (NAN(fVar1) || NAN(*pfVar9))) break;
    piVar10 = (int *)Imf_3_4::Header::lineOrder();
    iVar5 = *piVar10;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    piVar10 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar5 != *piVar10) {
      __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x180,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    piVar10 = (int *)Imf_3_4::Header::compression();
    iVar5 = *piVar10;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    piVar10 = (int *)Imf_3_4::Header::compression();
    if (iVar5 != *piVar10) {
      __assert_fail("header.compression () == headers[i].compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x181,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    this_00 = (ChannelList *)Imf_3_4::Header::channels();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    pCVar11 = (ChannelList *)Imf_3_4::Header::channels();
    bVar3 = Imf_3_4::ChannelList::operator==(this_00,pCVar11);
    if ((bVar3 & 1) == 0) {
      __assert_fail("header.channels () == headers[i].channels ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x182,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    Imf_3_4::Header::name_abi_cxx11_();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    Imf_3_4::Header::name_abi_cxx11_();
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    if (!_Var4) {
      __assert_fail("header.name () == headers[i].name ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x183,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    Imf_3_4::Header::type_abi_cxx11_();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               (anonymous_namespace)::headers,local_48._sizeY);
    Imf_3_4::Header::type_abi_cxx11_();
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    if (!_Var4) {
      __assert_fail("header.type () == headers[i].type ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                    ,0x184,"void (anonymous namespace)::readFiles(const std::string &)");
    }
    local_48._sizeY = local_48._sizeY + 1;
  }
  __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiTiledPartThreading.cpp"
                ,0x17f,"void (anonymous namespace)::readFiles(const std::string &)");
}

Assistant:

void
readFiles (const std::string& fn)
{

    cout << "Checking headers " << flush;
    MultiPartInputFile file (fn.c_str ());
    assert (file.parts () == 2);
    for (size_t i = 0; i < 2; i++)
    {
        const Header& header = file.header (i);
        assert (header.displayWindow () == headers[i].displayWindow ());
        assert (header.dataWindow () == headers[i].dataWindow ());
        assert (header.pixelAspectRatio () == headers[i].pixelAspectRatio ());
        assert (
            header.screenWindowCenter () == headers[i].screenWindowCenter ());
        assert (header.screenWindowWidth () == headers[i].screenWindowWidth ());
        assert (header.lineOrder () == headers[i].lineOrder ());
        assert (header.compression () == headers[i].compression ());
        assert (header.channels () == headers[i].channels ());
        assert (header.name () == headers[i].name ());
        assert (header.type () == headers[i].type ());
    }

    //
    // Preparing.
    //

    Array2D<unsigned int>  uData[2];
    Array2D<float>         fData[2];
    Array2D<half>          hData[2];
    vector<TiledInputPart> parts;
    for (int i = 0; i < 2; i++)
    {
        TiledInputPart part (file, i);
        parts.push_back (part);
    }

    //
    // Reading files.
    //

    cout << "Reading and comparing files " << flush;
    TiledInputPart& part = parts[0];

    int numXLevels = part.numXLevels ();
    int numYLevels = part.numYLevels ();

    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
        {
            if (!part.isValidLevel (xLevel, yLevel)) continue;

            int w = part.levelWidth (xLevel);
            int h = part.levelHeight (yLevel);

            FrameBuffer frameBuffers[2];

            for (int i = 0; i < 2; i++)
            {
                FrameBuffer& frameBuffer = frameBuffers[i];

                setInputFrameBuffer (
                    frameBuffer,
                    pixelTypes[i],
                    uData[i],
                    fData[i],
                    hData[i],
                    w,
                    h);
                parts[i].setFrameBuffer (frameBuffer);
            }

            TaskGroup   taskGroup;
            ThreadPool* threadPool = new ThreadPool (2);
            int         numXTiles  = part.numXTiles (xLevel);
            int         numYTiles  = part.numYTiles (yLevel);
            for (int i = 0; i < numYTiles; i++)
            {
                threadPool->addTask ((new ReadingTask (
                    &taskGroup, parts[0], xLevel, yLevel, i, numXTiles)));
                threadPool->addTask ((new ReadingTask (
                    &taskGroup, parts[1], xLevel, yLevel, i, numXTiles)));
            }
            delete threadPool;

            for (int i = 0; i < 2; i++)
            {
                switch (pixelTypes[i])
                {
                    case 0:
                        assert (checkPixels<unsigned int> (uData[i], w, h));
                        break;
                    case 1: assert (checkPixels<float> (fData[i], w, h)); break;
                    case 2: assert (checkPixels<half> (hData[i], w, h)); break;
                }
            }
        }
}